

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O0

void __thiscall nesvis::MemoryWidget::MemoryWidget(MemoryWidget *this,Nes *nes)

{
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3a0;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_378;
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_34e;
  less<unsigned_short> local_34d;
  int local_34c [9];
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_328;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  iterator local_1b8;
  _Alloc_hider local_1b0;
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a2;
  less<unsigned_short> local_1a1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  int local_190 [7];
  int local_174;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_170;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator local_28;
  _Alloc_hider local_20;
  Nes *local_18;
  Nes *nes_local;
  MemoryWidget *this_local;
  
  this->nes_ = nes;
  local_18 = nes;
  nes_local = (Nes *)this;
  std::__cxx11::string::string((string *)&this->goto_address_input_);
  std::optional<unsigned_short>::optional(&this->goto_address_);
  local_170 = &local_168;
  local_174 = 0;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[4],_true>(local_170,&local_174,(char (*) [4])"Ram");
  local_170 = &local_140;
  local_190[2] = 0x800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_170,local_190 + 2,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_170 = &local_118;
  local_190[1] = 0x1000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_170,local_190 + 1,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_170 = &local_f0;
  local_190[0] = 0x1800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_170,local_190,(char (*) [24])"Mirror of 0x0000-0x07FF");
  local_170 = &local_c8;
  local_1a0._12_4_ = 0x2000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[14],_true>
            (local_170,(int *)(local_1a0._M_local_buf + 0xc),(char (*) [14])"PPU Registers");
  local_170 = &local_a0;
  local_1a0._8_4_ = 0x2008;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_170,(int *)(local_1a0._M_local_buf + 8),(char (*) [24])"Mirror of 0x2000-0x2007")
  ;
  local_170 = &local_78;
  local_1a0._M_allocated_capacity._4_4_ = 0x4000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[21],_true>
            (local_170,(int *)(local_1a0._M_local_buf + 4),(char (*) [21])"Apu and I/O register");
  local_170 = &local_50;
  local_1a0._M_allocated_capacity._0_4_ = 0x4020;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>
            (local_170,(int *)local_1a0._M_local_buf,(char (*) [16])"Cartridge space");
  local_28 = &local_168;
  local_20._M_p = (pointer)0x8;
  std::
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_1a2);
  __l_00._M_len = (size_type)local_20._M_p;
  __l_00._M_array = local_28;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->cpu_mem_labels_,__l_00,&local_1a1,&local_1a2);
  std::
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_1a2);
  local_378 = (pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_28;
  do {
    local_378 = local_378 + -1;
    std::
    pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_378);
  } while (local_378 != &local_168);
  local_328 = &local_320;
  local_34c[8] = 0;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>(local_328,local_34c + 8,(char (*) [16])"Pattern table 0");
  local_328 = &local_2f8;
  local_34c[7] = 0x1000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[16],_true>(local_328,local_34c + 7,(char (*) [16])"Pattern table 1");
  local_328 = &local_2d0;
  local_34c[6] = 0x2000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(local_328,local_34c + 6,(char (*) [12])"Nametable 0");
  local_328 = &local_2a8;
  local_34c[5] = 0x2400;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(local_328,local_34c + 5,(char (*) [12])"Nametable 1");
  local_328 = &local_280;
  local_34c[4] = 0x2800;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(local_328,local_34c + 4,(char (*) [12])"Nametable 2");
  local_328 = &local_258;
  local_34c[3] = 0x2c00;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[12],_true>(local_328,local_34c + 3,(char (*) [12])"Nametable 3");
  local_328 = &local_230;
  local_34c[2] = 0x3000;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_328,local_34c + 2,(char (*) [24])"Mirror of 0x2000-0x2EFF");
  local_328 = &local_208;
  local_34c[1] = 0x3f00;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[8],_true>(local_328,local_34c + 1,(char (*) [8])"Palette");
  local_328 = &local_1e0;
  local_34c[0] = 0x3f20;
  std::
  pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[24],_true>
            (local_328,local_34c,(char (*) [24])"Mirror of 0x3F00-0x3F1F");
  local_1b8 = &local_320;
  local_1b0._M_p = (pointer)0x9;
  std::
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_34e);
  __l._M_len = (size_type)local_1b0._M_p;
  __l._M_array = local_1b8;
  std::
  map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ppu_mem_lables_,__l,&local_34d,&local_34e);
  std::
  allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_34e);
  local_3a0 = (pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1b8;
  do {
    local_3a0 = local_3a0 + -1;
    std::
    pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_3a0);
  } while (local_3a0 != &local_320);
  return;
}

Assistant:

explicit MemoryWidget(n_e_s::nes::Nes *nes) : nes_(nes) {}